

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

quaternion dja::operator*(quaternion *a,quaternion *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  quaternion qVar13;
  
  fVar1 = a->re;
  fVar2 = b->re;
  fVar3 = (a->im).z;
  fVar4 = (b->im).z;
  uVar5 = (a->im).x;
  uVar9 = (a->im).y;
  uVar6 = (b->im).x;
  uVar10 = (b->im).y;
  uVar7 = (b->im).y;
  uVar11 = (b->im).z;
  uVar8 = (a->im).y;
  uVar12 = (a->im).z;
  qVar13.im.y = ((float)uVar6 * (float)uVar12 - (float)uVar11 * (float)uVar5) +
                fVar2 * (float)uVar9 + fVar1 * (float)uVar10;
  qVar13.im.x = (fVar4 * (float)uVar8 - (float)uVar7 * fVar3) +
                fVar2 * (float)uVar5 + fVar1 * (float)uVar6;
  qVar13.re = fVar1 * fVar2 -
              (fVar3 * fVar4 + (float)uVar5 * (float)uVar6 + (float)uVar9 * (float)uVar10);
  qVar13.im.z = ((float)uVar10 * (float)uVar5 - (float)uVar9 * (float)uVar6) +
                fVar2 * fVar3 + fVar1 * fVar4;
  return qVar13;
}

Assistant:

Q OP*(const Q& a, const Q& b) {
    V1 re = a.re * b.re - dot(a.im, b.im);
    V3 im = a.re * b.im + a.im * b.re + cross(a.im, b.im);
    return Q(re, im);
}